

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

double __thiscall spvtools::opt::analysis::Constant::GetDouble(Constant *this)

{
  uint __line;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *__assertion;
  double dVar2;
  
  iVar1 = (*this->type_->_vptr_Type[0xc])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*this->type_->_vptr_Type[0xc])();
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x24) == 0x40) {
      iVar1 = (*this->_vptr_Constant[0xf])(this);
      if ((FloatConstant *)CONCAT44(extraout_var_01,iVar1) != (FloatConstant *)0x0) {
        dVar2 = FloatConstant::GetDoubleValue((FloatConstant *)CONCAT44(extraout_var_01,iVar1));
        return dVar2;
      }
      iVar1 = (*this->_vptr_Constant[0x16])(this);
      if (CONCAT44(extraout_var_02,iVar1) != 0) {
        return 0.0;
      }
      __assertion = "AsNullConstant() && \"Must be a floating point constant.\"";
      __line = 0x2a;
      goto LAB_001c3809;
    }
  }
  __assertion = "type()->AsFloat() != nullptr && type()->AsFloat()->width() == 64";
  __line = 0x25;
LAB_001c3809:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                ,__line,"double spvtools::opt::analysis::Constant::GetDouble() const");
}

Assistant:

double Constant::GetDouble() const {
  assert(type()->AsFloat() != nullptr && type()->AsFloat()->width() == 64);

  if (const FloatConstant* fc = AsFloatConstant()) {
    return fc->GetDoubleValue();
  } else {
    assert(AsNullConstant() && "Must be a floating point constant.");
    return 0.0;
  }
}